

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O2

void Imf_3_4::RgbaYca::decimateChromaHoriz(int n,Rgba *ycaIn,Rgba *ycaOut)

{
  long lVar1;
  Rgba *this;
  
  this = ycaOut;
  for (lVar1 = 0xd; lVar1 < n + 0xd; lVar1 = lVar1 + 1) {
    if ((lVar1 - 0xdU & 1) == 0) {
      Imath_3_2::half::operator=
                (&this->r,*(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 0xd].r._h * 4
                                    ) * 0.001064 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 0xb].r._h * 4
                                    ) * -0.003771 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 9].r._h * 4)
                          * 0.009801 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 7].r._h * 4)
                          * -0.021586 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 5].r._h * 4)
                          * 0.043978 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 3].r._h * 4)
                          * -0.093067 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 1].r._h * 4)
                          * 0.313659 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1].r._h * 4) *
                          0.499846 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -1].r._h * 4)
                          * 0.313659 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -3].r._h * 4)
                          * -0.093067 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -5].r._h * 4)
                          * 0.043978 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -7].r._h * 4)
                          * -0.021586 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -9].r._h * 4)
                          * 0.009801 +
                          *(float *)(_imath_half_to_float_table +
                                    (ulong)ycaIn[lVar1 + -0xd].r._h * 4) * 0.001064 +
                          *(float *)(_imath_half_to_float_table +
                                    (ulong)ycaIn[lVar1 + -0xb].r._h * 4) * -0.003771);
      Imath_3_2::half::operator=
                (&this->b,*(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 0xd].b._h * 4
                                    ) * 0.001064 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 0xb].b._h * 4
                                    ) * -0.003771 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 9].b._h * 4)
                          * 0.009801 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 7].b._h * 4)
                          * -0.021586 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 5].b._h * 4)
                          * 0.043978 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 3].b._h * 4)
                          * -0.093067 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + 1].b._h * 4)
                          * 0.313659 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1].b._h * 4) *
                          0.499846 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -1].b._h * 4)
                          * 0.313659 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -3].b._h * 4)
                          * -0.093067 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -5].b._h * 4)
                          * 0.043978 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -7].b._h * 4)
                          * -0.021586 +
                          *(float *)(_imath_half_to_float_table + (ulong)ycaIn[lVar1 + -9].b._h * 4)
                          * 0.009801 +
                          *(float *)(_imath_half_to_float_table +
                                    (ulong)ycaIn[lVar1 + -0xd].b._h * 4) * 0.001064 +
                          *(float *)(_imath_half_to_float_table +
                                    (ulong)ycaIn[lVar1 + -0xb].b._h * 4) * -0.003771);
    }
    ycaOut[lVar1 + -0xd].g._h = ycaIn[lVar1].g._h;
    ycaOut[lVar1 + -0xd].a._h = ycaIn[lVar1].a._h;
    this = this + 1;
  }
  return;
}

Assistant:

void
decimateChromaHoriz (int n, const Rgba ycaIn[/*n+N-1*/], Rgba ycaOut[/*n*/])
{
#ifdef DEBUG
    assert (ycaIn != ycaOut);
#endif

    int begin = N2;
    int end   = begin + n;

    for (int i = begin, j = 0; i < end; ++i, ++j)
    {
        if ((j & 1) == 0)
        {
            ycaOut[j].r =
                ycaIn[i - 13].r * 0.001064f + ycaIn[i - 11].r * -0.003771f +
                ycaIn[i - 9].r * 0.009801f + ycaIn[i - 7].r * -0.021586f +
                ycaIn[i - 5].r * 0.043978f + ycaIn[i - 3].r * -0.093067f +
                ycaIn[i - 1].r * 0.313659f + ycaIn[i].r * 0.499846f +
                ycaIn[i + 1].r * 0.313659f + ycaIn[i + 3].r * -0.093067f +
                ycaIn[i + 5].r * 0.043978f + ycaIn[i + 7].r * -0.021586f +
                ycaIn[i + 9].r * 0.009801f + ycaIn[i + 11].r * -0.003771f +
                ycaIn[i + 13].r * 0.001064f;

            ycaOut[j].b =
                ycaIn[i - 13].b * 0.001064f + ycaIn[i - 11].b * -0.003771f +
                ycaIn[i - 9].b * 0.009801f + ycaIn[i - 7].b * -0.021586f +
                ycaIn[i - 5].b * 0.043978f + ycaIn[i - 3].b * -0.093067f +
                ycaIn[i - 1].b * 0.313659f + ycaIn[i].b * 0.499846f +
                ycaIn[i + 1].b * 0.313659f + ycaIn[i + 3].b * -0.093067f +
                ycaIn[i + 5].b * 0.043978f + ycaIn[i + 7].b * -0.021586f +
                ycaIn[i + 9].b * 0.009801f + ycaIn[i + 11].b * -0.003771f +
                ycaIn[i + 13].b * 0.001064f;
        }

        ycaOut[j].g = ycaIn[i].g;
        ycaOut[j].a = ycaIn[i].a;
    }
}